

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     set_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
               (undefined4 *value,error_handler *param_2)

{
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_00;
  type tVar1;
  undefined8 arg;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  precision_checker<fmt::v5::internal::error_handler> local_20;
  
  arg_00.value_.field_0.string.size = in_stack_00000010;
  arg_00.value_.field_0.long_long_value = arg;
  arg_00._16_8_ = in_stack_00000018;
  arg_00._24_8_ = in_stack_00000020;
  local_20.handler_ = param_2;
  tVar1 = visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    (&local_20,arg_00);
  if ((tVar1 & 0xffffffff80000000) != 0) {
    error_handler::on_error(param_2,"number is too big");
  }
  *value = (int)tVar1;
  return;
}

Assistant:

FMT_CONSTEXPR void set_dynamic_spec(
    T &value, basic_format_arg<Context> arg, ErrorHandler eh) {
  unsigned long long big_value = visit(Handler<ErrorHandler>(eh), arg);
  if (big_value > (std::numeric_limits<int>::max)())
    eh.on_error("number is too big");
  value = static_cast<T>(big_value);
}